

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.h
# Opt level: O0

void __thiscall
slang::SourceManager::FileData::FileData
          (FileData *this,path *directory,string *name,SmallVector<char,_40UL> *data,path *fullPath)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  path *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  path *in_stack_ffffffffffffffb8;
  
  std::__cxx11::string::string(in_RCX,in_R8);
  SmallVector<char,_40UL>::SmallVector
            ((SmallVector<char,_40UL> *)in_RDX,(SmallVector<char,_40UL> *)in_stack_ffffffffffffffb8)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x33ed5f);
  *(undefined8 *)(in_RDI + 0x78) = in_RSI;
  std::filesystem::__cxx11::path::path(in_RDX,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

FileData(const std::filesystem::path* directory, std::string name, SmallVector<char>&& data,
                 std::filesystem::path fullPath) :
            name(std::move(name)), mem(std::move(data)), directory(directory),
            fullPath(std::move(fullPath)) {}